

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsLikeFunction(sqlite3 *db,Expr *pExpr,int *pIsNocase,char *aWc)

{
  int nArg;
  ExprList *pEVar1;
  Expr *pEVar2;
  undefined2 *puVar3;
  FuncDef *pFVar4;
  char *zEscape;
  Expr *pEscape;
  int nExpr;
  FuncDef *pDef;
  char *aWc_local;
  int *pIsNocase_local;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  if ((pExpr->op == 0xa1) && ((pExpr->x).pList != (ExprList *)0x0)) {
    nArg = ((pExpr->x).pList)->nExpr;
    pFVar4 = sqlite3FindFunction(db,(pExpr->u).zToken,nArg,'\x01','\0');
    if ((pFVar4 == (FuncDef *)0x0) || ((pFVar4->funcFlags & 4) == 0)) {
      db_local._4_4_ = 0;
    }
    else {
      if (nArg < 3) {
        aWc[3] = '\0';
      }
      else {
        pEVar1 = ((pExpr->x).pSelect)->pOrderBy;
        if ((char)pEVar1->nExpr != 'n') {
          return 0;
        }
        pEVar2 = pEVar1->a[0].pExpr;
        if ((pEVar2->op == '\0') || (pEVar2->affinity != '\0')) {
          return 0;
        }
        aWc[3] = pEVar2->op;
      }
      puVar3 = (undefined2 *)pFVar4->pUserData;
      *(undefined2 *)aWc = *puVar3;
      aWc[2] = *(char *)(puVar3 + 1);
      *pIsNocase = (uint)((pFVar4->funcFlags & 8) == 0);
      db_local._4_4_ = 1;
    }
  }
  else {
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsLikeFunction(sqlite3 *db, Expr *pExpr, int *pIsNocase, char *aWc){
  FuncDef *pDef;
  int nExpr;
  if( pExpr->op!=TK_FUNCTION || !pExpr->x.pList ){
    return 0;
  }
  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  nExpr = pExpr->x.pList->nExpr;
  pDef = sqlite3FindFunction(db, pExpr->u.zToken, nExpr, SQLITE_UTF8, 0);
  if( NEVER(pDef==0) || (pDef->funcFlags & SQLITE_FUNC_LIKE)==0 ){
    return 0;
  }
  if( nExpr<3 ){
    aWc[3] = 0;
  }else{
    Expr *pEscape = pExpr->x.pList->a[2].pExpr;
    char *zEscape;
    if( pEscape->op!=TK_STRING ) return 0;
    zEscape = pEscape->u.zToken;
    if( zEscape[0]==0 || zEscape[1]!=0 ) return 0;
    aWc[3] = zEscape[0];
  }

  /* The memcpy() statement assumes that the wildcard characters are
  ** the first three statements in the compareInfo structure.  The
  ** asserts() that follow verify that assumption
  */
  memcpy(aWc, pDef->pUserData, 3);
  assert( (char*)&likeInfoAlt == (char*)&likeInfoAlt.matchAll );
  assert( &((char*)&likeInfoAlt)[1] == (char*)&likeInfoAlt.matchOne );
  assert( &((char*)&likeInfoAlt)[2] == (char*)&likeInfoAlt.matchSet );
  *pIsNocase = (pDef->funcFlags & SQLITE_FUNC_CASE)==0;
  return 1;
}